

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

dht_settings * __thiscall
libtorrent::aux::session_impl::get_dht_settings
          (dht_settings *__return_storage_ptr__,session_impl *this)

{
  bool bVar1;
  int iVar2;
  session_settings *this_00;
  
  libtorrent::dht::dht_settings::dht_settings(__return_storage_ptr__);
  this_00 = &this->m_settings;
  iVar2 = session_settings::get_int(this_00,0x4089);
  __return_storage_ptr__->max_peers_reply = iVar2;
  iVar2 = session_settings::get_int(this_00,0x408a);
  __return_storage_ptr__->search_branching = iVar2;
  iVar2 = session_settings::get_int(this_00,0x408b);
  __return_storage_ptr__->max_fail_count = iVar2;
  iVar2 = session_settings::get_int(this_00,0x408c);
  __return_storage_ptr__->max_torrents = iVar2;
  iVar2 = session_settings::get_int(this_00,0x408d);
  __return_storage_ptr__->max_dht_items = iVar2;
  iVar2 = session_settings::get_int(this_00,0x408e);
  __return_storage_ptr__->max_peers = iVar2;
  iVar2 = session_settings::get_int(this_00,0x408f);
  __return_storage_ptr__->max_torrent_search_reply = iVar2;
  bVar1 = session_settings::get_bool(this_00,0x8046);
  __return_storage_ptr__->restrict_routing_ips = bVar1;
  bVar1 = session_settings::get_bool(this_00,0x8047);
  __return_storage_ptr__->restrict_search_ips = bVar1;
  bVar1 = session_settings::get_bool(this_00,0x8048);
  __return_storage_ptr__->extended_routing_table = bVar1;
  bVar1 = session_settings::get_bool(this_00,0x8049);
  __return_storage_ptr__->aggressive_lookups = bVar1;
  bVar1 = session_settings::get_bool(this_00,0x804a);
  __return_storage_ptr__->privacy_lookups = bVar1;
  bVar1 = session_settings::get_bool(this_00,0x804b);
  __return_storage_ptr__->enforce_node_id = bVar1;
  bVar1 = session_settings::get_bool(this_00,0x804c);
  __return_storage_ptr__->ignore_dark_internet = bVar1;
  iVar2 = session_settings::get_int(this_00,0x4090);
  __return_storage_ptr__->block_timeout = iVar2;
  iVar2 = session_settings::get_int(this_00,0x4091);
  __return_storage_ptr__->block_ratelimit = iVar2;
  bVar1 = session_settings::get_bool(this_00,0x804d);
  __return_storage_ptr__->read_only = bVar1;
  iVar2 = session_settings::get_int(this_00,0x4092);
  __return_storage_ptr__->item_lifetime = iVar2;
  iVar2 = session_settings::get_int(this_00,0x4052);
  __return_storage_ptr__->upload_rate_limit = iVar2;
  iVar2 = session_settings::get_int(this_00,0x4093);
  __return_storage_ptr__->sample_infohashes_interval = iVar2;
  iVar2 = session_settings::get_int(this_00,0x4094);
  __return_storage_ptr__->max_infohashes_sample_count = iVar2;
  return __return_storage_ptr__;
}

Assistant:

dht::dht_settings session_impl::get_dht_settings() const
	{
		dht::dht_settings sett;
#define SET_BOOL(name) \
		sett.name = m_settings.get_bool( settings_pack::dht_ ## name )
#define SET_INT(name) \
		sett.name = m_settings.get_int( settings_pack::dht_ ## name )

		SET_INT(max_peers_reply);
		SET_INT(search_branching);
		SET_INT(max_fail_count);
		SET_INT(max_torrents);
		SET_INT(max_dht_items);
		SET_INT(max_peers);
		SET_INT(max_torrent_search_reply);
		SET_BOOL(restrict_routing_ips);
		SET_BOOL(restrict_search_ips);
		SET_BOOL(extended_routing_table);
		SET_BOOL(aggressive_lookups);
		SET_BOOL(privacy_lookups);
		SET_BOOL(enforce_node_id);
		SET_BOOL(ignore_dark_internet);
		SET_INT(block_timeout);
		SET_INT(block_ratelimit);
		SET_BOOL(read_only);
		SET_INT(item_lifetime);
		SET_INT(upload_rate_limit);
		SET_INT(sample_infohashes_interval);
		SET_INT(max_infohashes_sample_count);
#undef SET_BOOL
#undef SET_INT
		return sett;
	}